

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeWriter.cpp
# Opt level: O2

void __thiscall CodeWriter::tag(CodeWriter *this,string *tag,bool isForEnd)

{
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::append((string *)this);
  std::__cxx11::string::append((string *)this);
  return;
}

Assistant:

void CodeWriter::tag(const std::string &tag, bool isForEnd) {
    moonOutput += tag;
    moonOutput += tab;
    moonOutput += nop;
    moonOutput += newLine;
}